

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixFullPathname(sqlite3_vfs *pVfs,char *zPath,int nOut,char *zOut)

{
  long lVar1;
  char *in_RCX;
  undefined4 in_EDX;
  char *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  DbPath path;
  char zPwd [4098];
  undefined4 in_stack_ffffffffffffefb0;
  int errcode;
  int local_1034;
  undefined1 local_1018 [4112];
  long local_8;
  
  errcode = (int)((ulong)in_RDI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_RSI != '/') {
    memset(local_1018,0xaa,0x1002);
    lVar1 = (*aSyscall[3].pCurrent)(local_1018,0x1000);
    if (lVar1 == 0) {
      sqlite3CantopenError(0);
      local_1034 = unixLogErrorAtLine(errcode,in_RSI,
                                      (char *)CONCAT44(in_EDX,in_stack_ffffffffffffefb0),
                                      (int)((ulong)in_RCX >> 0x20));
      goto LAB_00139612;
    }
    appendAllPathElements((DbPath *)CONCAT44(in_EDX,in_stack_ffffffffffffefb0),in_RCX);
  }
  appendAllPathElements((DbPath *)CONCAT44(in_EDX,in_stack_ffffffffffffefb0),in_RCX);
  *in_RCX = '\0';
  local_1034 = sqlite3CantopenError(0);
LAB_00139612:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_1034;
}

Assistant:

static int unixFullPathname(
  sqlite3_vfs *pVfs,            /* Pointer to vfs object */
  const char *zPath,            /* Possibly relative input path */
  int nOut,                     /* Size of output buffer in bytes */
  char *zOut                    /* Output buffer */
){
  DbPath path;
  UNUSED_PARAMETER(pVfs);
  path.rc = 0;
  path.nUsed = 0;
  path.nSymlink = 0;
  path.nOut = nOut;
  path.zOut = zOut;
  if( zPath[0]!='/' ){
    char zPwd[SQLITE_MAX_PATHLEN+2];
    if( osGetcwd(zPwd, sizeof(zPwd)-2)==0 ){
      return unixLogError(SQLITE_CANTOPEN_BKPT, "getcwd", zPath);
    }
    appendAllPathElements(&path, zPwd);
  }
  appendAllPathElements(&path, zPath);
  zOut[path.nUsed] = 0;
  if( path.rc || path.nUsed<2 ) return SQLITE_CANTOPEN_BKPT;
  if( path.nSymlink ) return SQLITE_OK_SYMLINK;
  return SQLITE_OK;
}